

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalCondition.hpp
# Opt level: O0

Status __thiscall
AO::BehaviorTree::Version_1::Details::DecimalCondition<float,_Agent,_short>::decide
          (DecimalCondition<float,_Agent,_short> *this,EntityPtr entity,short args)

{
  bool bVar1;
  DecimalCondition<float,_Agent,_short> *this_00;
  float lhs;
  bool local_42;
  bool local_3f;
  byte local_3c;
  byte local_39;
  float result;
  short args_local;
  EntityPtr entity_local;
  DecimalCondition<float,_Agent,_short> *this_local;
  
  this_00 = (DecimalCondition<float,_Agent,_short> *)&this->function;
  lhs = std::function<float_(Agent_*,_short)>::operator()
                  ((function<float_(Agent_*,_short)> *)this_00,entity,args);
  switch(this->condition) {
  case LessThan:
    local_39 = 0;
    if (lhs < this->target) {
      bVar1 = Equals(this_00,lhs,this->target,this->epsilon);
      local_39 = bVar1 ^ 0xff;
    }
    this_local._7_1_ = (local_39 & 1) == 0;
    break;
  case GreaterThan:
    local_3c = 0;
    if (this->target <= lhs && lhs != this->target) {
      bVar1 = Equals(this_00,lhs,this->target,this->epsilon);
      local_3c = bVar1 ^ 0xff;
    }
    this_local._7_1_ = (local_3c & 1) == 0;
    break;
  case LessOrEqualThan:
    local_3f = true;
    if (this->target <= lhs) {
      local_3f = Equals(this_00,lhs,this->target,this->epsilon);
    }
    this_local._7_1_ = local_3f == false;
    break;
  case GreaterOrEqualThan:
    local_42 = true;
    if (lhs < this->target || lhs == this->target) {
      local_42 = Equals(this_00,lhs,this->target,this->epsilon);
    }
    this_local._7_1_ = local_42 == false;
    break;
  case Equal:
    bVar1 = Equals(this_00,lhs,this->target,this->epsilon);
    this_local._7_1_ = !bVar1;
    break;
  case NotEqual:
    bVar1 = Equals(this_00,lhs,this->target,this->epsilon);
    this_local._7_1_ = ((bVar1 ^ 0xffU) & 1) == 0;
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

Status decide(EntityPtr entity, Args... args) override final
					{
						DecimalType const result = function(entity, args...);
						switch (condition)
						{
						case ConditionTest::LessThan:
							return result < target && !DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::GreaterThan:
							return result > target && !DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::LessOrEqualThan:
							return result < target || DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::GreaterOrEqualThan:
							return result > target || DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::Equal:
							return DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::NotEqual:
							return !DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						default:
							return Status::Failure;
						}
					}